

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::LayerParameter::SerializeWithCachedSizes(LayerParameter *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  uint uVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  void *pvVar6;
  Type *pTVar7;
  float *pfVar8;
  Type *value;
  Type *value_00;
  Type *pTVar9;
  bool *pbVar10;
  int iVar11;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    psVar4 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.LayerParameter.name");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output)
    ;
  }
  if ((uVar2 & 2) != 0) {
    psVar4 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.LayerParameter.type");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(2,(this->type_).ptr_,output)
    ;
  }
  iVar3 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar3) {
    pRVar1 = &this->bottom_;
    iVar11 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      pcVar5 = (pTVar7->_M_dataplus)._M_p;
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar5,(int)pTVar7->_M_string_length,SERIALIZE,"caffe.LayerParameter.bottom");
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::WriteString(3,pTVar7,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  iVar3 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar3) {
    pRVar1 = &this->top_;
    iVar11 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      pcVar5 = (pTVar7->_M_dataplus)._M_p;
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar5,(int)pTVar7->_M_string_length,SERIALIZE,"caffe.LayerParameter.top");
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&pRVar1->super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::WriteString(4,pTVar7,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  iVar3 = (this->loss_weight_).current_size_;
  if (0 < iVar3) {
    iVar11 = 0;
    do {
      pfVar8 = google::protobuf::RepeatedField<float>::Get(&this->loss_weight_,iVar11);
      google::protobuf::internal::WireFormatLite::WriteFloat(5,*pfVar8,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  iVar3 = (this->param_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    iVar11 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
                        (&(this->param_).super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (6,(MessageLite *)value,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  iVar3 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    iVar11 = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                           (&(this->blobs_).super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (7,(MessageLite *)value_00,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  iVar3 = (this->include_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    iVar11 = 0;
    do {
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                         (&(this->include_).super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (8,(MessageLite *)pTVar9,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  iVar3 = (this->exclude_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    iVar11 = 0;
    do {
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                         (&(this->exclude_).super_RepeatedPtrFieldBase,iVar11);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (9,(MessageLite *)pTVar9,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 6) & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(10,this->phase_,output);
  }
  iVar3 = (this->propagate_down_).current_size_;
  if (0 < iVar3) {
    iVar11 = 0;
    do {
      pbVar10 = google::protobuf::RepeatedField<bool>::Get(&this->propagate_down_,iVar11);
      google::protobuf::internal::WireFormatLite::WriteBool(0xb,*pbVar10,output);
      iVar11 = iVar11 + 1;
    } while (iVar3 != iVar11);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (100,(MessageLite *)this->transform_param_,output);
  }
  if ((uVar2 & 8) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x65,(MessageLite *)this->loss_param_,output);
  }
  if ((uVar2 & 0x10) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x66,(MessageLite *)this->accuracy_param_,output);
  }
  if ((uVar2 & 0x20) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x67,(MessageLite *)this->argmax_param_,output);
  }
  if ((uVar2 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x68,(MessageLite *)this->concat_param_,output);
  }
  if ((char)uVar2 < '\0') {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x69,(MessageLite *)this->contrastive_loss_param_,output);
  }
  if ((uVar2 >> 8 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x6a,(MessageLite *)this->convolution_param_,output);
  }
  if ((uVar2 >> 9 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x6b,(MessageLite *)this->data_param_,output);
  }
  if ((uVar2 >> 10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x6c,(MessageLite *)this->dropout_param_,output);
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x6d,(MessageLite *)this->dummy_data_param_,output);
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x6e,(MessageLite *)this->eltwise_param_,output);
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x6f,(MessageLite *)this->exp_param_,output);
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x70,(MessageLite *)this->hdf5_data_param_,output);
  }
  if ((short)uVar2 < 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x71,(MessageLite *)this->hdf5_output_param_,output);
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x72,(MessageLite *)this->hinge_loss_param_,output);
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x73,(MessageLite *)this->image_data_param_,output);
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x74,(MessageLite *)this->infogain_loss_param_,output);
  }
  if ((uVar2 >> 0x13 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x75,(MessageLite *)this->inner_product_param_,output);
  }
  if ((uVar2 >> 0x14 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x76,(MessageLite *)this->lrn_param_,output);
  }
  if ((uVar2 >> 0x15 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x77,(MessageLite *)this->memory_data_param_,output);
  }
  if ((uVar2 >> 0x16 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x78,(MessageLite *)this->mvn_param_,output);
  }
  if ((uVar2 >> 0x17 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x79,(MessageLite *)this->pooling_param_,output);
  }
  if ((uVar2 >> 0x18 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x7a,(MessageLite *)this->power_param_,output);
  }
  if ((uVar2 >> 0x19 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x7b,(MessageLite *)this->relu_param_,output);
  }
  if ((uVar2 >> 0x1a & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x7c,(MessageLite *)this->sigmoid_param_,output);
  }
  if ((uVar2 >> 0x1b & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x7d,(MessageLite *)this->softmax_param_,output);
  }
  if ((uVar2 >> 0x1c & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x7e,(MessageLite *)this->slice_param_,output);
  }
  if ((uVar2 >> 0x1d & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x7f,(MessageLite *)this->tanh_param_,output);
  }
  if ((uVar2 >> 0x1e & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x80,(MessageLite *)this->threshold_param_,output);
  }
  if ((int)uVar2 < 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x81,(MessageLite *)this->window_data_param_,output);
  }
  uVar2 = (this->_has_bits_).has_bits_[1];
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x82,(MessageLite *)this->python_param_,output);
  }
  if ((uVar2 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x83,(MessageLite *)this->prelu_param_,output);
  }
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x84,(MessageLite *)this->spp_param_,output);
  }
  if ((uVar2 & 8) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x85,(MessageLite *)this->reshape_param_,output);
  }
  if ((uVar2 & 0x10) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x86,(MessageLite *)this->log_param_,output);
  }
  if ((uVar2 & 0x20) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x87,(MessageLite *)this->flatten_param_,output);
  }
  if ((uVar2 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x88,(MessageLite *)this->reduction_param_,output);
  }
  if ((char)uVar2 < '\0') {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x89,(MessageLite *)this->embed_param_,output);
  }
  if ((uVar2 >> 8 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x8a,(MessageLite *)this->tile_param_,output);
  }
  if ((uVar2 >> 9 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x8b,(MessageLite *)this->batch_norm_param_,output);
  }
  if ((uVar2 >> 10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x8c,(MessageLite *)this->elu_param_,output);
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x8d,(MessageLite *)this->bias_param_,output);
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x8e,(MessageLite *)this->scale_param_,output);
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x8f,(MessageLite *)this->input_param_,output);
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x90,(MessageLite *)this->crop_param_,output);
  }
  if ((short)uVar2 < 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x91,(MessageLite *)this->parameter_param_,output);
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x92,(MessageLite *)this->recurrent_param_,output);
  }
  pvVar6 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar6 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void LayerParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->type(), output);
  }

  // repeated string bottom = 3;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.bottom");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->bottom(i), output);
  }

  // repeated string top = 4;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.top");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      4, this->top(i), output);
  }

  // repeated float loss_weight = 5;
  for (int i = 0, n = this->loss_weight_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      5, this->loss_weight(i), output);
  }

  // repeated .caffe.ParamSpec param = 6;
  for (unsigned int i = 0, n = this->param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->param(i), output);
  }

  // repeated .caffe.BlobProto blobs = 7;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->blobs(i), output);
  }

  // repeated .caffe.NetStateRule include = 8;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->include(i), output);
  }

  // repeated .caffe.NetStateRule exclude = 9;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, this->exclude(i), output);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.Phase phase = 10;
  if (cached_has_bits & 0x00020000u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      10, this->phase(), output);
  }

  // repeated bool propagate_down = 11;
  for (int i = 0, n = this->propagate_down_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(
      11, this->propagate_down(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional .caffe.TransformationParameter transform_param = 100;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      100, *this->transform_param_, output);
  }

  // optional .caffe.LossParameter loss_param = 101;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      101, *this->loss_param_, output);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 102;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      102, *this->accuracy_param_, output);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 103;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      103, *this->argmax_param_, output);
  }

  // optional .caffe.ConcatParameter concat_param = 104;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      104, *this->concat_param_, output);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 105;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      105, *this->contrastive_loss_param_, output);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 106;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      106, *this->convolution_param_, output);
  }

  // optional .caffe.DataParameter data_param = 107;
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      107, *this->data_param_, output);
  }

  // optional .caffe.DropoutParameter dropout_param = 108;
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      108, *this->dropout_param_, output);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 109;
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      109, *this->dummy_data_param_, output);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 110;
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      110, *this->eltwise_param_, output);
  }

  // optional .caffe.ExpParameter exp_param = 111;
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      111, *this->exp_param_, output);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 112;
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      112, *this->hdf5_data_param_, output);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 113;
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      113, *this->hdf5_output_param_, output);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 114;
  if (cached_has_bits & 0x00010000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      114, *this->hinge_loss_param_, output);
  }

  // optional .caffe.ImageDataParameter image_data_param = 115;
  if (cached_has_bits & 0x00020000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      115, *this->image_data_param_, output);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 116;
  if (cached_has_bits & 0x00040000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      116, *this->infogain_loss_param_, output);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 117;
  if (cached_has_bits & 0x00080000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      117, *this->inner_product_param_, output);
  }

  // optional .caffe.LRNParameter lrn_param = 118;
  if (cached_has_bits & 0x00100000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      118, *this->lrn_param_, output);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 119;
  if (cached_has_bits & 0x00200000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      119, *this->memory_data_param_, output);
  }

  // optional .caffe.MVNParameter mvn_param = 120;
  if (cached_has_bits & 0x00400000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      120, *this->mvn_param_, output);
  }

  // optional .caffe.PoolingParameter pooling_param = 121;
  if (cached_has_bits & 0x00800000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      121, *this->pooling_param_, output);
  }

  // optional .caffe.PowerParameter power_param = 122;
  if (cached_has_bits & 0x01000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      122, *this->power_param_, output);
  }

  // optional .caffe.ReLUParameter relu_param = 123;
  if (cached_has_bits & 0x02000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      123, *this->relu_param_, output);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 124;
  if (cached_has_bits & 0x04000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      124, *this->sigmoid_param_, output);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 125;
  if (cached_has_bits & 0x08000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      125, *this->softmax_param_, output);
  }

  // optional .caffe.SliceParameter slice_param = 126;
  if (cached_has_bits & 0x10000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      126, *this->slice_param_, output);
  }

  // optional .caffe.TanHParameter tanh_param = 127;
  if (cached_has_bits & 0x20000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      127, *this->tanh_param_, output);
  }

  // optional .caffe.ThresholdParameter threshold_param = 128;
  if (cached_has_bits & 0x40000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      128, *this->threshold_param_, output);
  }

  // optional .caffe.WindowDataParameter window_data_param = 129;
  if (cached_has_bits & 0x80000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      129, *this->window_data_param_, output);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.PythonParameter python_param = 130;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      130, *this->python_param_, output);
  }

  // optional .caffe.PReLUParameter prelu_param = 131;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      131, *this->prelu_param_, output);
  }

  // optional .caffe.SPPParameter spp_param = 132;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      132, *this->spp_param_, output);
  }

  // optional .caffe.ReshapeParameter reshape_param = 133;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      133, *this->reshape_param_, output);
  }

  // optional .caffe.LogParameter log_param = 134;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      134, *this->log_param_, output);
  }

  // optional .caffe.FlattenParameter flatten_param = 135;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      135, *this->flatten_param_, output);
  }

  // optional .caffe.ReductionParameter reduction_param = 136;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      136, *this->reduction_param_, output);
  }

  // optional .caffe.EmbedParameter embed_param = 137;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      137, *this->embed_param_, output);
  }

  // optional .caffe.TileParameter tile_param = 138;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      138, *this->tile_param_, output);
  }

  // optional .caffe.BatchNormParameter batch_norm_param = 139;
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      139, *this->batch_norm_param_, output);
  }

  // optional .caffe.ELUParameter elu_param = 140;
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      140, *this->elu_param_, output);
  }

  // optional .caffe.BiasParameter bias_param = 141;
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      141, *this->bias_param_, output);
  }

  // optional .caffe.ScaleParameter scale_param = 142;
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      142, *this->scale_param_, output);
  }

  // optional .caffe.InputParameter input_param = 143;
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      143, *this->input_param_, output);
  }

  // optional .caffe.CropParameter crop_param = 144;
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      144, *this->crop_param_, output);
  }

  // optional .caffe.ParameterParameter parameter_param = 145;
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      145, *this->parameter_param_, output);
  }

  // optional .caffe.RecurrentParameter recurrent_param = 146;
  if (cached_has_bits & 0x00010000u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      146, *this->recurrent_param_, output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.LayerParameter)
}